

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

void __thiscall ASDCP::MXF::FileDescriptor::FileDescriptor(FileDescriptor *this,FileDescriptor *rhs)

{
  byte_t *value;
  UL local_48;
  FileDescriptor *local_18;
  FileDescriptor *rhs_local;
  FileDescriptor *this_local;
  
  local_18 = rhs;
  rhs_local = this;
  GenericDescriptor::GenericDescriptor
            (&this->super_GenericDescriptor,
             (rhs->super_GenericDescriptor).super_InterchangeObject.m_Dict);
  (this->super_GenericDescriptor).super_InterchangeObject.super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__FileDescriptor_0033a5f8;
  optional_property<unsigned_int>::optional_property(&this->LinkedTrackID);
  Rational::Rational(&this->SampleRate);
  optional_property<unsigned_long_long>::optional_property(&this->ContainerDuration);
  UL::UL(&this->EssenceContainer);
  optional_property<ASDCP::UL>::optional_property(&this->Codec);
  if ((this->super_GenericDescriptor).super_InterchangeObject.m_Dict != (Dictionary *)0x0) {
    value = Dictionary::ul((this->super_GenericDescriptor).super_InterchangeObject.m_Dict,
                           MDD_FileDescriptor);
    UL::UL(&local_48,value);
    UL::operator=(&(this->super_GenericDescriptor).super_InterchangeObject.super_KLVPacket.m_UL,
                  &local_48);
    UL::~UL(&local_48);
    (*(this->super_GenericDescriptor).super_InterchangeObject.super_KLVPacket._vptr_KLVPacket[0x14])
              (this,local_18);
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0x55e,"ASDCP::MXF::FileDescriptor::FileDescriptor(const FileDescriptor &)");
}

Assistant:

FileDescriptor::FileDescriptor(const FileDescriptor& rhs) : GenericDescriptor(rhs.m_Dict)
{
  assert(m_Dict);
  m_UL = m_Dict->ul(MDD_FileDescriptor);
  Copy(rhs);
}